

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O0

void __thiscall wallet::CKeyPool::Serialize<DataStream>(CKeyPool *this,DataStream *s)

{
  long lVar1;
  CPubKey *in_RSI;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::operator<<(in_RDI,(int *)in_RSI);
  DataStream::operator<<(in_RDI,(long *)in_RSI);
  DataStream::operator<<(in_RDI,in_RSI);
  DataStream::operator<<(in_RDI,(bool *)in_RSI);
  DataStream::operator<<(in_RDI,(bool *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        s << int{259900}; // Unused field, writes the highest client version ever written
        s << nTime << vchPubKey << fInternal << m_pre_split;
    }